

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall
PrecomputedTransactionData::Init<CTransaction>
          (PrecomputedTransactionData *this,CTransaction *txTo,
          vector<CTxOut,_std::allocator<CTxOut>_> *spent_outputs,bool force)

{
  pointer pCVar1;
  pointer pCVar2;
  size_type *psVar3;
  pointer pCVar4;
  pointer *ppvVar5;
  pointer pCVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  pointer local_48;
  uchar auStack_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_spent_outputs_ready == true) {
    __assert_fail("!m_spent_outputs_ready",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                  ,0x578,
                  "void PrecomputedTransactionData::Init(const T &, std::vector<CTxOut> &&, bool) [T = CTransaction]"
                 );
  }
  local_48 = (this->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  pCVar1 = (spent_outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       (this->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_58._8_8_ =
       (this->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start =
       (spent_outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish = pCVar1;
  (this->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (spent_outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (spent_outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (spent_outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (spent_outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_58);
  pCVar1 = (this->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (this->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar1 == pCVar2) {
    pCVar4 = (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar6 = (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar8 = (long)pCVar6 - (long)pCVar4 >> 3;
  }
  else {
    pCVar4 = (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar6 = (txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar8 = (long)pCVar6 - (long)pCVar4 >> 3;
    if (((long)pCVar2 - (long)pCVar1 >> 3) * -0x3333333333333333 + lVar8 * -0x4ec4ec4ec4ec4ec5 != 0)
    {
      __assert_fail("m_spent_outputs.size() == txTo.vin.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                    ,0x57c,
                    "void PrecomputedTransactionData::Init(const T &, std::vector<CTxOut> &&, bool) [T = CTransaction]"
                   );
    }
    this->m_spent_outputs_ready = true;
  }
  if (pCVar6 == pCVar4 || force) {
    bVar11 = 1;
    bVar10 = 1;
    if (!force) goto LAB_007892b2;
  }
  else {
    ppvVar5 = &(pCVar4->scriptWitness).stack.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    psVar3 = &(pCVar1->scriptPubKey).super_CScriptBase._size;
    uVar7 = 1;
    bVar10 = force;
    do {
      bVar11 = bVar10;
      if (((((_Vector_impl_data *)(ppvVar5 + -1))->_M_start == *ppvVar5) ||
          (bVar11 = 1, (this->m_spent_outputs_ready & 1U) == 0)) || (bVar11 = 1, *psVar3 != 0x3f)) {
LAB_00789113:
        bVar10 = bVar11;
        bVar9 = force;
        if ((force & 1U) != 0) goto LAB_0078911f;
        bVar11 = bVar10 & force;
      }
      else {
        bVar9 = 1;
        bVar11 = 1;
        if (*(((CScriptBase *)(psVar3 + -7))->_union).indirect_contents.indirect != 'Q')
        goto LAB_00789113;
LAB_0078911f:
        force = (bool)bVar9;
        if ((bVar10 & 1) != 0) break;
        bVar11 = 0;
      }
      if ((ulong)(lVar8 * 0x4ec4ec4ec4ec4ec5) <= uVar7) break;
      uVar7 = uVar7 + 1;
      ppvVar5 = ppvVar5 + 0xd;
      psVar3 = psVar3 + 10;
    } while ((bVar11 & 1) == 0);
    if (((bVar10 | force) & 1) == 0) goto LAB_007892b2;
    bVar11 = bVar10 ^ 1 | force;
  }
  anon_unknown.dwarf_324fcc6::GetPrevoutsSHA256<CTransaction>((uint256 *)local_58,txTo);
  *(pointer *)((this->m_prevouts_single_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_48;
  *(uchar (*) [8])((this->m_prevouts_single_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
       auStack_40;
  *(undefined8 *)(this->m_prevouts_single_hash).super_base_blob<256U>.m_data._M_elems =
       local_58._0_8_;
  *(undefined8 *)((this->m_prevouts_single_hash).super_base_blob<256U>.m_data._M_elems + 8) =
       local_58._8_8_;
  anon_unknown.dwarf_324fcc6::GetSequencesSHA256<CTransaction>((uint256 *)local_58,txTo);
  *(pointer *)((this->m_sequences_single_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_48;
  *(uchar (*) [8])((this->m_sequences_single_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
       auStack_40;
  *(undefined8 *)(this->m_sequences_single_hash).super_base_blob<256U>.m_data._M_elems =
       local_58._0_8_;
  *(undefined8 *)((this->m_sequences_single_hash).super_base_blob<256U>.m_data._M_elems + 8) =
       local_58._8_8_;
  anon_unknown.dwarf_324fcc6::GetOutputsSHA256<CTransaction>((uint256 *)local_58,txTo);
  *(pointer *)((this->m_outputs_single_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_48;
  *(uchar (*) [8])((this->m_outputs_single_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
       auStack_40;
  *(undefined8 *)(this->m_outputs_single_hash).super_base_blob<256U>.m_data._M_elems =
       local_58._0_8_;
  *(undefined8 *)((this->m_outputs_single_hash).super_base_blob<256U>.m_data._M_elems + 8) =
       local_58._8_8_;
  if ((bVar10 & 1) != 0) {
    SHA256Uint256((uint256 *)local_58,&this->m_prevouts_single_hash);
    *(pointer *)((this->hashPrevouts).super_base_blob<256U>.m_data._M_elems + 0x10) = local_48;
    *(uchar (*) [8])((this->hashPrevouts).super_base_blob<256U>.m_data._M_elems + 0x18) = auStack_40
    ;
    *(undefined8 *)(this->hashPrevouts).super_base_blob<256U>.m_data._M_elems = local_58._0_8_;
    *(undefined8 *)((this->hashPrevouts).super_base_blob<256U>.m_data._M_elems + 8) = local_58._8_8_
    ;
    SHA256Uint256((uint256 *)local_58,&this->m_sequences_single_hash);
    *(pointer *)((this->hashSequence).super_base_blob<256U>.m_data._M_elems + 0x10) = local_48;
    *(uchar (*) [8])((this->hashSequence).super_base_blob<256U>.m_data._M_elems + 0x18) = auStack_40
    ;
    *(undefined8 *)(this->hashSequence).super_base_blob<256U>.m_data._M_elems = local_58._0_8_;
    *(undefined8 *)((this->hashSequence).super_base_blob<256U>.m_data._M_elems + 8) = local_58._8_8_
    ;
    SHA256Uint256((uint256 *)local_58,&this->m_outputs_single_hash);
    *(pointer *)((this->hashOutputs).super_base_blob<256U>.m_data._M_elems + 0x10) = local_48;
    *(uchar (*) [8])((this->hashOutputs).super_base_blob<256U>.m_data._M_elems + 0x18) = auStack_40;
    *(undefined8 *)(this->hashOutputs).super_base_blob<256U>.m_data._M_elems = local_58._0_8_;
    *(undefined8 *)((this->hashOutputs).super_base_blob<256U>.m_data._M_elems + 8) = local_58._8_8_;
    this->m_bip143_segwit_ready = true;
  }
  if (((bVar11 & 1) != 0) && (this->m_spent_outputs_ready == true)) {
    anon_unknown.dwarf_324fcc6::GetSpentAmountsSHA256((uint256 *)local_58,&this->m_spent_outputs);
    *(pointer *)((this->m_spent_amounts_single_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_48;
    *(uchar (*) [8])
     ((this->m_spent_amounts_single_hash).super_base_blob<256U>.m_data._M_elems + 0x18) = auStack_40
    ;
    *(undefined8 *)(this->m_spent_amounts_single_hash).super_base_blob<256U>.m_data._M_elems =
         local_58._0_8_;
    *(undefined8 *)((this->m_spent_amounts_single_hash).super_base_blob<256U>.m_data._M_elems + 8) =
         local_58._8_8_;
    anon_unknown.dwarf_324fcc6::GetSpentScriptsSHA256((uint256 *)local_58,&this->m_spent_outputs);
    *(pointer *)((this->m_spent_scripts_single_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_48;
    *(uchar (*) [8])
     ((this->m_spent_scripts_single_hash).super_base_blob<256U>.m_data._M_elems + 0x18) = auStack_40
    ;
    *(undefined8 *)(this->m_spent_scripts_single_hash).super_base_blob<256U>.m_data._M_elems =
         local_58._0_8_;
    *(undefined8 *)((this->m_spent_scripts_single_hash).super_base_blob<256U>.m_data._M_elems + 8) =
         local_58._8_8_;
    this->m_bip341_taproot_ready = true;
  }
LAB_007892b2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PrecomputedTransactionData::Init(const T& txTo, std::vector<CTxOut>&& spent_outputs, bool force)
{
    assert(!m_spent_outputs_ready);

    m_spent_outputs = std::move(spent_outputs);
    if (!m_spent_outputs.empty()) {
        assert(m_spent_outputs.size() == txTo.vin.size());
        m_spent_outputs_ready = true;
    }

    // Determine which precomputation-impacting features this transaction uses.
    bool uses_bip143_segwit = force;
    bool uses_bip341_taproot = force;
    for (size_t inpos = 0; inpos < txTo.vin.size() && !(uses_bip143_segwit && uses_bip341_taproot); ++inpos) {
        if (!txTo.vin[inpos].scriptWitness.IsNull()) {
            if (m_spent_outputs_ready && m_spent_outputs[inpos].scriptPubKey.size() == 2 + WITNESS_V1_TAPROOT_SIZE &&
                m_spent_outputs[inpos].scriptPubKey[0] == OP_1) {
                // Treat every witness-bearing spend with 34-byte scriptPubKey that starts with OP_1 as a Taproot
                // spend. This only works if spent_outputs was provided as well, but if it wasn't, actual validation
                // will fail anyway. Note that this branch may trigger for scriptPubKeys that aren't actually segwit
                // but in that case validation will fail as SCRIPT_ERR_WITNESS_UNEXPECTED anyway.
                uses_bip341_taproot = true;
            } else {
                // Treat every spend that's not known to native witness v1 as a Witness v0 spend. This branch may
                // also be taken for unknown witness versions, but it is harmless, and being precise would require
                // P2SH evaluation to find the redeemScript.
                uses_bip143_segwit = true;
            }
        }
        if (uses_bip341_taproot && uses_bip143_segwit) break; // No need to scan further if we already need all.
    }

    if (uses_bip143_segwit || uses_bip341_taproot) {
        // Computations shared between both sighash schemes.
        m_prevouts_single_hash = GetPrevoutsSHA256(txTo);
        m_sequences_single_hash = GetSequencesSHA256(txTo);
        m_outputs_single_hash = GetOutputsSHA256(txTo);
    }
    if (uses_bip143_segwit) {
        hashPrevouts = SHA256Uint256(m_prevouts_single_hash);
        hashSequence = SHA256Uint256(m_sequences_single_hash);
        hashOutputs = SHA256Uint256(m_outputs_single_hash);
        m_bip143_segwit_ready = true;
    }
    if (uses_bip341_taproot && m_spent_outputs_ready) {
        m_spent_amounts_single_hash = GetSpentAmountsSHA256(m_spent_outputs);
        m_spent_scripts_single_hash = GetSpentScriptsSHA256(m_spent_outputs);
        m_bip341_taproot_ready = true;
    }
}